

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_analyzer.cc
# Opt level: O1

void __thiscall AnalyzerDecl::~AnalyzerDecl(AnalyzerDecl *this)

{
  StateVarList *pSVar1;
  AnalyzerActionList *pAVar2;
  AnalyzerHelperList *pAVar3;
  Function *this_00;
  FunctionList *pFVar4;
  ParamList *pPVar5;
  Param *this_01;
  pointer ppSVar6;
  pointer ppAVar7;
  pointer ppAVar8;
  pointer ppFVar9;
  pointer ppPVar10;
  
  (this->super_TypeDecl).super_Decl._vptr_Decl = (_func_int **)&PTR__AnalyzerDecl_00143e08;
  if (this->statevars_ != (StateVarList *)0x0) {
    for (ppSVar6 = (this->statevars_->super__Vector_base<StateVar_*,_std::allocator<StateVar_*>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        ppSVar6 !=
        (this->statevars_->super__Vector_base<StateVar_*,_std::allocator<StateVar_*>_>)._M_impl.
        super__Vector_impl_data._M_finish; ppSVar6 = ppSVar6 + 1) {
      if (*ppSVar6 != (StateVar *)0x0) {
        operator_delete(*ppSVar6,0x10);
      }
    }
  }
  pSVar1 = this->statevars_;
  if (pSVar1 != (StateVarList *)0x0) {
    ppSVar6 = (pSVar1->super__Vector_base<StateVar_*,_std::allocator<StateVar_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (ppSVar6 != (pointer)0x0) {
      operator_delete(ppSVar6,(long)(pSVar1->
                                    super__Vector_base<StateVar_*,_std::allocator<StateVar_*>_>).
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)ppSVar6);
    }
    operator_delete(pSVar1,0x18);
  }
  this->statevars_ = (StateVarList *)0x0;
  if (this->actions_ != (AnalyzerActionList *)0x0) {
    for (ppAVar7 = (this->actions_->
                   super__Vector_base<AnalyzerAction_*,_std::allocator<AnalyzerAction_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        ppAVar7 !=
        (this->actions_->super__Vector_base<AnalyzerAction_*,_std::allocator<AnalyzerAction_*>_>).
        _M_impl.super__Vector_impl_data._M_finish; ppAVar7 = ppAVar7 + 1) {
      if (*ppAVar7 != (AnalyzerAction *)0x0) {
        (*((*ppAVar7)->super_AnalyzerElement)._vptr_AnalyzerElement[1])();
      }
    }
  }
  pAVar2 = this->actions_;
  if (pAVar2 != (AnalyzerActionList *)0x0) {
    ppAVar7 = (pAVar2->super__Vector_base<AnalyzerAction_*,_std::allocator<AnalyzerAction_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if (ppAVar7 != (pointer)0x0) {
      operator_delete(ppAVar7,(long)(pAVar2->
                                    super__Vector_base<AnalyzerAction_*,_std::allocator<AnalyzerAction_*>_>
                                    )._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)ppAVar7);
    }
    operator_delete(pAVar2,0x18);
  }
  this->actions_ = (AnalyzerActionList *)0x0;
  if (this->helpers_ != (AnalyzerHelperList *)0x0) {
    for (ppAVar8 = (this->helpers_->
                   super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        ppAVar8 !=
        (this->helpers_->super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>).
        _M_impl.super__Vector_impl_data._M_finish; ppAVar8 = ppAVar8 + 1) {
      if (*ppAVar8 != (AnalyzerHelper *)0x0) {
        (*((*ppAVar8)->super_AnalyzerElement)._vptr_AnalyzerElement[1])();
      }
    }
  }
  pAVar3 = this->helpers_;
  if (pAVar3 != (AnalyzerHelperList *)0x0) {
    ppAVar8 = (pAVar3->super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if (ppAVar8 != (pointer)0x0) {
      operator_delete(ppAVar8,(long)(pAVar3->
                                    super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>
                                    )._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)ppAVar8);
    }
    operator_delete(pAVar3,0x18);
  }
  this->helpers_ = (AnalyzerHelperList *)0x0;
  if (this->functions_ != (FunctionList *)0x0) {
    for (ppFVar9 = (this->functions_->super__Vector_base<Function_*,_std::allocator<Function_*>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        ppFVar9 !=
        (this->functions_->super__Vector_base<Function_*,_std::allocator<Function_*>_>)._M_impl.
        super__Vector_impl_data._M_finish; ppFVar9 = ppFVar9 + 1) {
      this_00 = *ppFVar9;
      if (this_00 != (Function *)0x0) {
        Function::~Function(this_00);
        operator_delete(this_00,0x80);
      }
    }
  }
  pFVar4 = this->functions_;
  if (pFVar4 != (FunctionList *)0x0) {
    ppFVar9 = (pFVar4->super__Vector_base<Function_*,_std::allocator<Function_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (ppFVar9 != (pointer)0x0) {
      operator_delete(ppFVar9,(long)(pFVar4->
                                    super__Vector_base<Function_*,_std::allocator<Function_*>_>).
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)ppFVar9);
    }
    operator_delete(pFVar4,0x18);
  }
  this->functions_ = (FunctionList *)0x0;
  pPVar5 = (this->super_TypeDecl).params_;
  if (pPVar5 != (ParamList *)0x0) {
    for (ppPVar10 = (pPVar5->super__Vector_base<Param_*,_std::allocator<Param_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
        ppPVar10 !=
        (((this->super_TypeDecl).params_)->super__Vector_base<Param_*,_std::allocator<Param_*>_>).
        _M_impl.super__Vector_impl_data._M_finish; ppPVar10 = ppPVar10 + 1) {
      this_01 = *ppPVar10;
      if (this_01 != (Param *)0x0) {
        Param::~Param(this_01);
        operator_delete(this_01,0x80);
      }
    }
  }
  pPVar5 = (this->super_TypeDecl).params_;
  if (pPVar5 != (ParamList *)0x0) {
    ppPVar10 = (pPVar5->super__Vector_base<Param_*,_std::allocator<Param_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    if (ppPVar10 != (pointer)0x0) {
      operator_delete(ppPVar10,(long)(pPVar5->super__Vector_base<Param_*,_std::allocator<Param_*>_>)
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)ppPVar10);
    }
    operator_delete(pPVar5,0x18);
  }
  (this->super_TypeDecl).params_ = (ParamList *)0x0;
  if (this->constructor_helpers_ != (AnalyzerHelperList *)0x0) {
    for (ppAVar8 = (this->constructor_helpers_->
                   super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        ppAVar8 !=
        (this->constructor_helpers_->
        super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>)._M_impl.
        super__Vector_impl_data._M_finish; ppAVar8 = ppAVar8 + 1) {
      if (*ppAVar8 != (AnalyzerHelper *)0x0) {
        (*((*ppAVar8)->super_AnalyzerElement)._vptr_AnalyzerElement[1])();
      }
    }
  }
  pAVar3 = this->constructor_helpers_;
  if (pAVar3 != (AnalyzerHelperList *)0x0) {
    ppAVar8 = (pAVar3->super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if (ppAVar8 != (pointer)0x0) {
      operator_delete(ppAVar8,(long)(pAVar3->
                                    super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>
                                    )._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)ppAVar8);
    }
    operator_delete(pAVar3,0x18);
  }
  this->constructor_helpers_ = (AnalyzerHelperList *)0x0;
  if (this->destructor_helpers_ != (AnalyzerHelperList *)0x0) {
    for (ppAVar8 = (this->destructor_helpers_->
                   super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        ppAVar8 !=
        (this->destructor_helpers_->
        super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>)._M_impl.
        super__Vector_impl_data._M_finish; ppAVar8 = ppAVar8 + 1) {
      if (*ppAVar8 != (AnalyzerHelper *)0x0) {
        (*((*ppAVar8)->super_AnalyzerElement)._vptr_AnalyzerElement[1])();
      }
    }
  }
  pAVar3 = this->destructor_helpers_;
  if (pAVar3 != (AnalyzerHelperList *)0x0) {
    ppAVar8 = (pAVar3->super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if (ppAVar8 != (pointer)0x0) {
      operator_delete(ppAVar8,(long)(pAVar3->
                                    super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>
                                    )._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)ppAVar8);
    }
    operator_delete(pAVar3,0x18);
  }
  this->destructor_helpers_ = (AnalyzerHelperList *)0x0;
  if (this->eof_helpers_ != (AnalyzerHelperList *)0x0) {
    for (ppAVar8 = (this->eof_helpers_->
                   super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        ppAVar8 !=
        (this->eof_helpers_->super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>
        )._M_impl.super__Vector_impl_data._M_finish; ppAVar8 = ppAVar8 + 1) {
      if (*ppAVar8 != (AnalyzerHelper *)0x0) {
        (*((*ppAVar8)->super_AnalyzerElement)._vptr_AnalyzerElement[1])();
      }
    }
  }
  pAVar3 = this->eof_helpers_;
  if (pAVar3 != (AnalyzerHelperList *)0x0) {
    ppAVar8 = (pAVar3->super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if (ppAVar8 != (pointer)0x0) {
      operator_delete(ppAVar8,(long)(pAVar3->
                                    super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>
                                    )._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)ppAVar8);
    }
    operator_delete(pAVar3,0x18);
  }
  this->eof_helpers_ = (AnalyzerHelperList *)0x0;
  TypeDecl::~TypeDecl(&this->super_TypeDecl);
  return;
}

Assistant:

AnalyzerDecl::~AnalyzerDecl()
	{
	delete_list(StateVarList, statevars_);
	delete_list(AnalyzerActionList, actions_);
	delete_list(AnalyzerHelperList, helpers_);
	delete_list(FunctionList, functions_);
	delete_list(ParamList, params_);
	delete_list(AnalyzerHelperList, constructor_helpers_);
	delete_list(AnalyzerHelperList, destructor_helpers_);
	delete_list(AnalyzerHelperList, eof_helpers_);
	}